

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O0

void __thiscall
checkqueue_tests::test_CheckQueue_Recovers_From_Failure::test_method
          (test_CheckQueue_Recovers_From_Failure *this)

{
  long lVar1;
  const_iterator pbVar2;
  reference pvVar3;
  long in_FS_OFFSET;
  bool r;
  bool end_fails;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<bool> *__range2;
  int times;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  __single_object fail_queue;
  CCheckQueueControl<FailingCheck> control;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  lazy_ostream *in_stack_fffffffffffffed0;
  value_type *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
  *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  unit_test_log_t *in_stack_fffffffffffffef8;
  const_iterator local_f0;
  int local_dc;
  const_string local_d0 [2];
  lazy_ostream local_b0 [2];
  assertion_result local_90 [2];
  bool local_52;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> local_50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_unique<CCheckQueue<FailingCheck>,unsigned_int_const&,int_const&>
            ((uint *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (int *)in_stack_fffffffffffffee8);
  for (local_dc = 0; local_dc < 10; local_dc = local_dc + 1) {
    local_f0 = std::initializer_list<bool>::begin
                         ((initializer_list<bool> *)in_stack_fffffffffffffeb8);
    pbVar2 = std::initializer_list<bool>::end
                       ((initializer_list<bool> *)
                        CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    for (; local_f0 != pbVar2; local_f0 = local_f0 + 1) {
      std::unique_ptr<CCheckQueue<FailingCheck>,_std::default_delete<CCheckQueue<FailingCheck>_>_>::
      get((unique_ptr<CCheckQueue<FailingCheck>,_std::default_delete<CCheckQueue<FailingCheck>_>_> *
          )in_stack_fffffffffffffeb8);
      CCheckQueueControl<FailingCheck>::CCheckQueueControl
                ((CCheckQueueControl<FailingCheck> *)
                 CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                 (CCheckQueue<FakeCheckCheckCompletion> *)
                 CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
      std::vector<FailingCheck,_std::allocator<FailingCheck>_>::vector
                ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                 in_stack_fffffffffffffeb8);
      FailingCheck::FailingCheck((FailingCheck *)in_stack_fffffffffffffeb8,false);
      std::vector<FailingCheck,_std::allocator<FailingCheck>_>::resize
                (in_stack_fffffffffffffee8,
                 CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffed8);
      FailingCheck::FailingCheck((FailingCheck *)in_stack_fffffffffffffeb8,false);
      in_stack_fffffffffffffee8 = &local_50;
      pvVar3 = std::vector<FailingCheck,_std::allocator<FailingCheck>_>::operator[]
                         ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                           *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                          CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
      pvVar3->fails = local_52;
      CCheckQueueControl<FailingCheck>::Add
                ((CCheckQueueControl<FailingCheck> *)
                 CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                 (vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                 CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
      std::vector<FailingCheck,_std::allocator<FailingCheck>_>::~vector
                ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                 CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
      in_stack_fffffffffffffee7 =
           CCheckQueueControl<FailingCheck>::Wait
                     ((CCheckQueueControl<FailingCheck> *)in_stack_fffffffffffffed0);
      in_stack_fffffffffffffef0 =
           CONCAT13(in_stack_fffffffffffffee7,(int3)in_stack_fffffffffffffef0);
      do {
        in_stack_fffffffffffffed8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                   (pointer)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                   (unsigned_long)in_stack_fffffffffffffeb8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffeb8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffffef8,
                   (const_string *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   (size_t)in_stack_fffffffffffffee8,
                   (const_string *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8)
                   ,(bool)in_stack_fffffffffffffec7);
        in_stack_fffffffffffffed0 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                   (pointer)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                   (unsigned_long)in_stack_fffffffffffffeb8);
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                   (basic_cstring<const_char> *)in_stack_fffffffffffffeb8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                   (pointer)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                   (unsigned_long)in_stack_fffffffffffffeb8);
        in_stack_fffffffffffffeb8 =
             (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
              *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_90,local_b0,local_d0,0x103,REQUIRE,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl(in_stack_fffffffffffffeb8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffeb8);
        in_stack_fffffffffffffecf = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_fffffffffffffecf);
      CCheckQueueControl<FailingCheck>::~CCheckQueueControl
                ((CCheckQueueControl<FailingCheck> *)
                 CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    }
  }
  std::unique_ptr<CCheckQueue<FailingCheck>,_std::default_delete<CCheckQueue<FailingCheck>_>_>::
  ~unique_ptr((unique_ptr<CCheckQueue<FailingCheck>,_std::default_delete<CCheckQueue<FailingCheck>_>_>
               *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueue_Recovers_From_Failure)
{
    auto fail_queue = std::make_unique<Failing_Queue>(QUEUE_BATCH_SIZE, SCRIPT_CHECK_THREADS);
    for (auto times = 0; times < 10; ++times) {
        for (const bool end_fails : {true, false}) {
            CCheckQueueControl<FailingCheck> control(fail_queue.get());
            {
                std::vector<FailingCheck> vChecks;
                vChecks.resize(100, false);
                vChecks[99] = end_fails;
                control.Add(std::move(vChecks));
            }
            bool r =control.Wait();
            BOOST_REQUIRE(r != end_fails);
        }
    }
}